

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O0

void GetEntropyUnrefined_C(uint32_t *X,int length,VP8LBitEntropy *bit_entropy,VP8LStreaks *stats)

{
  uint64_t uVar1;
  int *in_RCX;
  VP8LBitEntropy *in_RDX;
  uint32_t in_ESI;
  uint32_t *in_RDI;
  uint32_t x;
  uint32_t x_prev;
  int i_prev;
  int i;
  uint32_t in_stack_ffffffffffffffd0;
  uint32_t v;
  undefined4 uVar2;
  int iVar3;
  int in_stack_fffffffffffffff0;
  
  uVar2 = 0;
  v = *in_RDI;
  memset(in_RCX,0,0x18);
  VP8LBitEntropyInit(in_RDX);
  for (iVar3 = 1; iVar3 < (int)in_ESI; iVar3 = iVar3 + 1) {
    in_stack_ffffffffffffffd0 = in_RDI[iVar3];
    if (in_stack_ffffffffffffffd0 != v) {
      GetEntropyUnrefinedHelper
                (in_ESI,in_stack_fffffffffffffff0,(uint32_t *)in_RDX,in_RCX,
                 (VP8LBitEntropy *)CONCAT44(iVar3,uVar2),
                 (VP8LStreaks *)CONCAT44(v,in_stack_ffffffffffffffd0));
    }
  }
  GetEntropyUnrefinedHelper
            (in_ESI,in_stack_fffffffffffffff0,(uint32_t *)in_RDX,in_RCX,
             (VP8LBitEntropy *)CONCAT44(iVar3,uVar2),
             (VP8LStreaks *)CONCAT44(v,in_stack_ffffffffffffffd0));
  uVar1 = VP8LFastSLog2(v);
  in_RDX->entropy = uVar1 - in_RDX->entropy;
  return;
}

Assistant:

static void GetEntropyUnrefined_C(
    const uint32_t X[], int length,
    VP8LBitEntropy* WEBP_RESTRICT const bit_entropy,
    VP8LStreaks* WEBP_RESTRICT const stats) {
  int i;
  int i_prev = 0;
  uint32_t x_prev = X[0];

  memset(stats, 0, sizeof(*stats));
  VP8LBitEntropyInit(bit_entropy);

  for (i = 1; i < length; ++i) {
    const uint32_t x = X[i];
    if (x != x_prev) {
      GetEntropyUnrefinedHelper(x, i, &x_prev, &i_prev, bit_entropy, stats);
    }
  }
  GetEntropyUnrefinedHelper(0, i, &x_prev, &i_prev, bit_entropy, stats);

  bit_entropy->entropy = VP8LFastSLog2(bit_entropy->sum) - bit_entropy->entropy;
}